

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

Option * __thiscall CLI::App::get_option_no_throw(App *this,string *option_name)

{
  pointer puVar1;
  pointer psVar2;
  App *this_00;
  pointer pcVar3;
  bool bVar4;
  Option *pOVar5;
  Option *unaff_RBX;
  pointer puVar6;
  shared_ptr<CLI::App> *subc;
  pointer psVar7;
  bool bVar8;
  string local_50;
  
  puVar6 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar8 = puVar6 == puVar1;
    if (bVar8) {
LAB_0013d49a:
      if (bVar8) {
        psVar7 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = (this->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar7 != psVar2) {
          do {
            this_00 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            bVar8 = true;
            if ((this_00->name_)._M_string_length == 0) {
              pcVar3 = (option_name->_M_dataplus)._M_p;
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,pcVar3,pcVar3 + option_name->_M_string_length);
              pOVar5 = get_option_no_throw(this_00,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              bVar8 = pOVar5 == (Option *)0x0;
              if (!bVar8) {
                unaff_RBX = pOVar5;
              }
            }
            if (!bVar8) {
              return unaff_RBX;
            }
            psVar7 = psVar7 + 1;
          } while (psVar7 != psVar2);
        }
        unaff_RBX = (Option *)0x0;
      }
      return unaff_RBX;
    }
    bVar4 = Option::check_name((puVar6->_M_t).
                               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                               .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,option_name
                              );
    if (bVar4) {
      unaff_RBX = (puVar6->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      goto LAB_0013d49a;
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const Option *App::get_option_no_throw(std::string option_name) const noexcept {
    for(const Option_p &opt : options_) {
        if(opt->check_name(option_name)) {
            return opt.get();
        }
    }
    for(const auto &subc : subcommands_) {
        // also check down into nameless subcommands
        if(subc->get_name().empty()) {
            auto *opt = subc->get_option_no_throw(option_name);
            if(opt != nullptr) {
                return opt;
            }
        }
    }
    return nullptr;
}